

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O1

int can_twoweapon(void)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  boolean bVar4;
  size_t sVar5;
  char *pcVar6;
  Race *pRVar7;
  char *pcVar8;
  obj *poVar9;
  char *pcVar10;
  char kbuf [256];
  char local_128 [264];
  
  if ((youmonst.data)->mattk[1].aatyp == 0xfe) {
    if (uwep == (obj *)0x0 || uswapwep == (obj *)0x0) {
      pcVar6 = "";
      if (uswapwep != (obj *)0x0) {
        pcVar6 = "right ";
      }
      pcVar8 = "left ";
      if (uwep == (obj *)0x0) {
        pcVar8 = pcVar6;
      }
      pcVar6 = body_part(6);
      pcVar10 = " is";
      if (uswapwep == (obj *)0x0 && uwep == (obj *)0x0) {
        pcVar10 = "s are";
      }
      pline("Your %s%s%s empty.",pcVar8,pcVar6,pcVar10);
      return 0;
    }
    bVar1 = uwep->oclass;
    if (bVar1 == 6) {
      if (objects[uwep->otyp].oc_subtyp != '\0') {
LAB_00286e6b:
        bVar3 = uswapwep->oclass;
        if ((bVar3 == 2) || ((bVar3 == 6 && (objects[uswapwep->otyp].oc_subtyp != '\0')))) {
          if ((((bVar1 | 4) == 6) && ((objects[uwep->otyp].field_0x11 & 1) != 0)) ||
             (((bVar3 | 4) == 6 && ((objects[uswapwep->otyp].field_0x11 & 1) != 0)))) {
            if (((bVar1 | 4) != 6) || (poVar9 = uwep, (objects[uwep->otyp].field_0x11 & 1) == 0)) {
              poVar9 = uswapwep;
            }
            pcVar6 = Yname2(poVar9);
            pcVar8 = "%s isn\'t one-handed.";
            goto LAB_00286fac;
          }
          if (uarms != (obj *)0x0) {
            pcVar6 = "You can\'t use two weapons while wearing a shield.";
LAB_00286df7:
            pline(pcVar6);
            return 0;
          }
          if (uswapwep->oartifact == '\0') {
            if ((((uarmg != (obj *)0x0) || (u.uprops[8].extrinsic != 0)) ||
                (((byte)youmonst.mintrinsics & 0x80) != 0)) ||
               ((uswapwep->otyp != 0x10e || (1 < uswapwep->corpsenm - 0xbU)))) {
              if (u.uprops[0x29].intrinsic == 0) {
                if ((uswapwep->field_0x4a & 1) == 0) {
                  return 1;
                }
                uswapwep->field_0x4a = uswapwep->field_0x4a | 0x40;
              }
              drop_uswapwep();
              return 0;
            }
            pcVar6 = mons_mname(mons + uswapwep->corpsenm);
            pcVar8 = body_part(6);
            pline("You wield the %s corpse with your bare %s.",pcVar6,pcVar8);
            pcVar6 = mons_mname(mons + uswapwep->corpsenm);
            pcVar6 = an(pcVar6);
            sprintf(local_128,"%s corpse",pcVar6);
            bVar4 = delayed_petrify((char *)0x0,local_128);
            if (bVar4 == '\0') {
              return 0;
            }
            pcVar6 = mons_mname(mons + uswapwep->corpsenm);
            pcVar8 = "You release the %s corpse!";
            goto LAB_00286fac;
          }
          pcVar6 = Yname2(uswapwep);
          pcVar8 = otense(uswapwep,"resist");
          pcVar10 = "%s %s being held second to another weapon!";
          goto LAB_00286f03;
        }
      }
    }
    else if (bVar1 == 2) goto LAB_00286e6b;
    poVar9 = uwep;
    if (bVar1 == 6) {
      if (objects[uwep->otyp].oc_subtyp != '\0') {
LAB_00286ec0:
        poVar9 = uswapwep;
      }
    }
    else if (bVar1 == 2) goto LAB_00286ec0;
    pcVar6 = Yname2(poVar9);
    if (poVar9->quan < 2) {
      pcVar8 = "isn\'t a weapon";
      if (poVar9->oartifact == '\x1d') {
        pcVar8 = "aren\'t weapons";
      }
    }
    else {
      pcVar8 = "aren\'t weapons";
    }
    pcVar10 = "%s %s.";
LAB_00286f03:
    pline(pcVar10,pcVar6,pcVar8);
    return 0;
  }
  if ((((youmonst.data)->mflags1 & 0x2000) != 0) || ((youmonst.data)->msize == '\0')) {
    pcVar6 = "Don\'t be ridiculous!";
    goto LAB_00286df7;
  }
  if (u.umonnum != u.umonster) {
    pcVar6 = "You can\'t use two weapons in your current form.";
    goto LAB_00286df7;
  }
  uVar2 = (youmonst.data)->mattk[1].aatyp;
  local_128[0] = '\0';
  if (u.weapon_skills[0x26].max_skill < '\x02') {
LAB_00286da8:
    pcVar6 = urole.name.f;
    if (urole.name.f == (char *)0x0) {
      pcVar6 = urole.name.m;
    }
    if (flags.female == '\0') {
      pcVar6 = urole.name.m;
    }
    strcat(local_128,pcVar6);
  }
  else {
    pRVar7 = (Race *)&urace.adj;
    if (uVar2 != 0xfe) {
      pRVar7 = &urace;
    }
    strcpy(local_128,pRVar7->noun);
    if (uVar2 == 0xfe) {
      sVar5 = strlen(local_128);
      (local_128 + sVar5)[0] = ' ';
      (local_128 + sVar5)[1] = '\0';
      goto LAB_00286da8;
    }
  }
  pcVar6 = upstart(local_128);
  pcVar6 = makeplural(pcVar6);
  pcVar8 = "%s aren\'t able to use two weapons at once.";
LAB_00286fac:
  pline(pcVar8,pcVar6);
  return 0;
}

Assistant:

int can_twoweapon(void)
{
	struct obj *otmp;

#define NOT_WEAPON(obj) (!is_weptool(obj) && obj->oclass != WEAPON_CLASS)
	if (!could_twoweap(youmonst.data)) {
		if (cantwield(youmonst.data)) {
		    pline("Don't be ridiculous!");
		} else if (Upolyd) {
		    pline("You can't use two weapons in your current form.");
		} else {
		    char buf[BUFSZ];
		    boolean disallowed_by_role = P_MAX_SKILL(P_TWO_WEAPON_COMBAT) < P_BASIC;
		    boolean disallowed_by_race = youmonst.data->mattk[1].aatyp != AT_WEAP;
		    buf[0] = '\0';
		    if (!disallowed_by_role)
			strcpy(buf, disallowed_by_race ? urace.noun : urace.adj);
		    if (disallowed_by_role || !disallowed_by_race) {
			if (!disallowed_by_role)
			    strcat(buf, " ");
			strcat(buf, (flags.female && urole.name.f) ?
				    urole.name.f : urole.name.m);
		    }
		    pline("%s aren't able to use two weapons at once.",
			  makeplural(upstart(buf)));
		}
	} else if (!uwep || !uswapwep)
		pline("Your %s%s%s empty.", uwep ? "left " : uswapwep ? "right " : "",
			body_part(HAND), (!uwep && !uswapwep) ? "s are" : " is");
	else if (NOT_WEAPON(uwep) || NOT_WEAPON(uswapwep)) {
		otmp = NOT_WEAPON(uwep) ? uwep : uswapwep;
		pline("%s %s.", Yname2(otmp),
		    is_plural(otmp) ? "aren't weapons" : "isn't a weapon");
	} else if (bimanual(uwep) || bimanual(uswapwep)) {
		otmp = bimanual(uwep) ? uwep : uswapwep;
		pline("%s isn't one-handed.", Yname2(otmp));
	} else if (uarms)
		pline("You can't use two weapons while wearing a shield.");
	else if (uswapwep->oartifact)
		pline("%s %s being held second to another weapon!",
			Yname2(uswapwep), otense(uswapwep, "resist"));
	else if (!uarmg && !Stone_resistance && (uswapwep->otyp == CORPSE &&
		    touch_petrifies(&mons[uswapwep->corpsenm]))) {
		char kbuf[BUFSZ];

		pline("You wield the %s corpse with your bare %s.",
		    mons_mname(&mons[uswapwep->corpsenm]), body_part(HAND));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uswapwep->corpsenm])));
		if (delayed_petrify(NULL, kbuf)) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uswapwep->corpsenm]));
		}
	} else if (Glib || uswapwep->cursed) {
		if (!Glib)
			uswapwep->bknown = TRUE;
		drop_uswapwep();
	} else
		return TRUE;
	return FALSE;
}